

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTransfer.cpp
# Opt level: O0

bool __thiscall CTransfer::BindListen(CTransfer *this)

{
  int iVar1;
  undefined4 local_1c;
  CTransfer *pCStack_18;
  int opt;
  CTransfer *this_local;
  
  pCStack_18 = this;
  iVar1 = socket(2,1,0);
  this->sock = iVar1;
  if (this->sock == -1) {
    perror("control socket create error:");
    this_local._7_1_ = false;
  }
  else {
    this->pollfds[0].fd = this->sock;
    this->pollfds[0].events = 1;
    local_1c = 1;
    setsockopt(this->sock,1,2,&local_1c,4);
    iVar1 = bind(this->sock,(sockaddr *)&this->sockaddr,0x10);
    if (iVar1 == -1) {
      perror("bind error:");
      this_local._7_1_ = false;
    }
    else {
      iVar1 = listen(this->sock,10);
      if (iVar1 == -1) {
        perror("listen error:");
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CTransfer::BindListen() {
    sock = socket(AF_INET,SOCK_STREAM,0);
    if(sock == -1){
        perror("control socket create error:");
        return false;
    }
    pollfds[0].fd = sock;
    pollfds[0].events = POLLIN;

    int opt = 1;
    setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (const void *)&opt, sizeof(opt));

    if(bind(sock,(struct sockaddr*)&sockaddr,sizeof(sockaddr)) == -1){
        perror("bind error:");
        return false;
    }

    if(listen(sock,10) == -1){
        perror("listen error:");
        return false;
    }

    return true;
}